

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128x2.cc
# Opt level: O2

int aead_aegis_128x2_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  int line;
  ulong uVar2;
  uint local_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint8_t local_1d0 [16];
  uint8_t local_1c0 [64];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  
  if (nonce_len < 0x11) {
    if (ctx->tag_len == in_tag_len) {
      aegis_128x2_state_init((ctx->state).opaque,nonce,nonce_len,(aes_block_t_conflict *)&local_180)
      ;
      for (uVar2 = 0x40; uVar2 <= ad_len; uVar2 = uVar2 + 0x40) {
        aead_aegis_128x2_enc((uint8_t *)&local_220,ad,(aes_block_t_conflict *)&local_180);
        ad = ad + 0x40;
      }
      uVar2 = ad_len & 0x3f;
      if (uVar2 != 0) {
        memset(local_1c0 + uVar2,0,0x40 - uVar2);
        memcpy(local_1c0,ad,uVar2);
        aead_aegis_128x2_enc((uint8_t *)&local_220,local_1c0,(aes_block_t_conflict *)&local_180);
      }
      for (uVar2 = 0x40; uVar2 <= in_len; uVar2 = uVar2 + 0x40) {
        aead_aegis_128x2_dec(out,in,(aes_block_t_conflict *)&local_180);
        in = in + 0x40;
        out = out + 0x40;
      }
      uVar2 = in_len & 0x3f;
      if (uVar2 != 0) {
        memset((void *)((long)&local_220 + uVar2),0,0x40 - uVar2);
        memcpy(&local_220,in,uVar2);
        aead_aegis_128x2_dec
                  ((uint8_t *)&local_220,(uint8_t *)&local_220,(aes_block_t_conflict *)&local_180);
        memcpy(out,&local_220,uVar2);
        memset(&local_220,0,uVar2);
        local_180 = local_220 ^ local_180;
        uStack_17c = uStack_21c ^ uStack_17c;
        uStack_178 = uStack_218 ^ uStack_178;
        uStack_174 = uStack_214 ^ uStack_174;
        uStack_170 = uStack_210 ^ uStack_170;
        uStack_16c = uStack_20c ^ uStack_16c;
        uStack_168 = uStack_208 ^ uStack_168;
        uStack_164 = uStack_204 ^ uStack_164;
        local_100 = local_200 ^ local_100;
        uStack_fc = uStack_1fc ^ uStack_fc;
        uStack_f8 = uStack_1f8 ^ uStack_f8;
        uStack_f4 = uStack_1f4 ^ uStack_f4;
        uStack_f0 = uStack_1f0 ^ uStack_f0;
        uStack_ec = uStack_1ec ^ uStack_ec;
        uStack_e8 = uStack_1e8 ^ uStack_e8;
        uStack_e4 = uStack_1e4 ^ uStack_e4;
      }
      aead_aegis_128x2_tag(local_1d0,ad_len,in_len,(aes_block_t_conflict *)&local_180);
      iVar1 = CRYPTO_memcmp(local_1d0,in_tag,in_tag_len);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = 0x65;
      line = 0x198;
    }
    else {
      iVar1 = 0x65;
      line = 0x178;
    }
  }
  else {
    iVar1 = 0x79;
    line = 0x174;
  }
  ERR_put_error(0x1e,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128x2.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128x2_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                        const uint8_t *nonce, size_t nonce_len,
                                        const uint8_t *in, size_t in_len,
                                        const uint8_t *in_tag,
                                        size_t in_tag_len, const uint8_t *ad,
                                        size_t ad_len) {
  const struct aead_aegis_128x2_ctx *aegis_ctx =
      (struct aead_aegis_128x2_ctx *)&ctx->state;

  return aegis_128x2_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                                 in_len, in_tag, in_tag_len, ad, ad_len,
                                 ctx->tag_len);
}